

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::String::String(String *this,char *s)

{
  int iVar1;
  size_t sVar2;
  uchar *__dest;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (s == (char *)0x0) {
    return;
  }
  sVar2 = strlen(s);
  (this->super_tagbstring).slen = (int)sVar2;
  iVar1 = (int)sVar2 + 1;
  (this->super_tagbstring).mlen = iVar1;
  __dest = (uchar *)malloc((long)iVar1);
  (this->super_tagbstring).data = __dest;
  if (__dest != (uchar *)0x0) {
    memcpy(__dest,s,(long)iVar1);
    return;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
          "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
          ,0x84,"Failure in (char *) constructor");
  return;
}

Assistant:

String::String(const char *s)
    {
        slen = mlen = 0; data = 0;
        if (s)
        {
            slen = (int)strlen(s);
            mlen = slen + 1;
            data = (unsigned char*)malloc(mlen);

            if (!data)
            {
                mlen = slen = 0;
                bstringThrow("Failure in (char *) constructor");
            }
            else memcpy(data, s, mlen);
        }
    }